

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_chrome_tracing.cpp
# Opt level: O0

ostream * KokkosTools::ChromeTracing::operator<<(ostream *os,StackKind kind)

{
  StackKind kind_local;
  ostream *os_local;
  
  switch(kind) {
  case STACK_FOR:
    std::operator<<(os,"[for]");
    break;
  case STACK_REDUCE:
    std::operator<<(os,"[reduce]");
    break;
  case STACK_SCAN:
    std::operator<<(os,"[scan]");
    break;
  case STACK_REGION:
    std::operator<<(os,"[region]");
    break;
  case STACK_COPY:
    std::operator<<(os,"[copy]");
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, StackKind kind) {
  switch (kind) {
    case STACK_FOR: os << "[for]"; break;
    case STACK_REDUCE: os << "[reduce]"; break;
    case STACK_SCAN: os << "[scan]"; break;
    case STACK_REGION: os << "[region]"; break;
    case STACK_COPY: os << "[copy]"; break;
  };
  return os;
}